

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests.c
# Opt level: O3

void test_ecmult_accumulate(secp256k1_sha256 *acc,secp256k1_scalar *x,secp256k1_scratch *scratch)

{
  int iVar1;
  ulong uVar2;
  code *pcVar3;
  secp256k1_scalar *ng;
  secp256k1_scalar *psVar4;
  size_t sVar5;
  secp256k1_gej *r_00;
  ulong uVar6;
  long lVar7;
  secp256k1_strauss_point_state *scratch_00;
  secp256k1_strauss_point_state *elem;
  code *cb;
  secp256k1_scalar *cbdata;
  secp256k1_callback *error_callback;
  ulong uVar8;
  secp256k1_strauss_point_state *r_01;
  size_t size;
  secp256k1_ge r;
  secp256k1_gej rj6;
  secp256k1_gej rj3;
  secp256k1_gej rj2;
  secp256k1_gej rj1;
  secp256k1_gej rj5;
  uchar bytes [65];
  secp256k1_gej infj;
  secp256k1_gej gj;
  secp256k1_gej rj4;
  ulong uStack_1430;
  secp256k1_strauss_state sStack_1428;
  secp256k1_fe asStack_1410 [8];
  secp256k1_strauss_point_state sStack_12d0;
  secp256k1_ge asStack_ec0 [8];
  secp256k1_scratch *psStack_bf8;
  secp256k1_callback *psStack_bf0;
  secp256k1_gej *psStack_be8;
  secp256k1_strauss_point_state *psStack_be0;
  secp256k1_strauss_point_state *psStack_bd8;
  secp256k1_strauss_point_state *psStack_bd0;
  size_t sStack_bc0;
  undefined1 local_ba8 [8];
  undefined1 local_ba0 [88];
  secp256k1_gej local_b48;
  secp256k1_gej local_ac8;
  secp256k1_gej local_a48;
  secp256k1_gej local_9c8;
  secp256k1_gej local_948 [2];
  secp256k1_strauss_point_state local_808;
  secp256k1_gej local_3f8;
  secp256k1_gej local_378;
  
  local_ba8 = (undefined1  [8])0x41;
  local_378.infinity = 0;
  local_378.x.n[0] = 0x2815b16f81798;
  local_378.x.n[1] = 0xdb2dce28d959f;
  local_378.x.n[2] = 0xe870b07029bfc;
  local_378.x.n[3] = 0xbbac55a06295c;
  local_378.x.n[4] = 0x79be667ef9dc;
  local_378.y.n[4] = 0x483ada7726a3;
  local_378.y.n[0] = 0x7d08ffb10d4b8;
  local_378.y.n[1] = 0x48a68554199c4;
  local_378.y.n[2] = 0xe1108a8fd17b4;
  local_378.y.n[3] = 0xc4655da4fbfc0;
  local_378.z.n[0] = 1;
  local_378.z.n[1] = 0;
  local_378.z.n[2] = 0;
  local_378.z.n[3] = 0;
  local_378.z.n[4] = 0;
  local_3f8.infinity = 1;
  local_3f8.z.n[4] = 0;
  local_3f8.z.n[2] = 0;
  local_3f8.z.n[3] = 0;
  local_3f8.z.n[0] = 0;
  local_3f8.z.n[1] = 0;
  local_3f8.y.n[3] = 0;
  local_3f8.y.n[4] = 0;
  local_3f8.y.n[1] = 0;
  local_3f8.y.n[2] = 0;
  local_3f8.x.n[4] = 0;
  local_3f8.y.n[0] = 0;
  local_3f8.x.n[2] = 0;
  local_3f8.x.n[3] = 0;
  local_3f8.x.n[0] = 0;
  local_3f8.x.n[1] = 0;
  psStack_bd0 = (secp256k1_strauss_point_state *)0x1694ef;
  secp256k1_ecmult_gen(&CTX->ecmult_gen_ctx,&local_9c8,x);
  r_01 = (secp256k1_strauss_point_state *)&stack0xfffffffffffffd08;
  psStack_bd0 = (secp256k1_strauss_point_state *)0x16953c;
  local_ac8.x.n[0] = (uint64_t)local_948;
  local_ac8.x.n[1] = (uint64_t)r_01;
  local_ac8.x.n[2] = (uint64_t)&local_808;
  secp256k1_ecmult_strauss_wnaf
            ((secp256k1_strauss_state *)&local_ac8,&local_a48,1,&local_378,x,&secp256k1_scalar_zero)
  ;
  psStack_bd0 = (secp256k1_strauss_point_state *)0x16956f;
  local_b48.x.n[0] = (uint64_t)local_948;
  local_b48.x.n[1] = (uint64_t)r_01;
  local_b48.x.n[2] = (uint64_t)&local_808;
  secp256k1_ecmult_strauss_wnaf
            ((secp256k1_strauss_state *)&local_b48,&local_ac8,1,&local_3f8,&secp256k1_scalar_zero,x)
  ;
  error_callback = (secp256k1_callback *)0xb8;
  elem = (secp256k1_strauss_point_state *)&CTX->error_callback;
  cb = (secp256k1_ecmult_multi_callback *)0x0;
  cbdata = (secp256k1_scalar *)0x0;
  psStack_bd0 = (secp256k1_strauss_point_state *)0x16959e;
  ng = x;
  scratch_00 = (secp256k1_strauss_point_state *)scratch;
  iVar1 = secp256k1_ecmult_multi_var
                    ((secp256k1_callback *)elem,scratch,(secp256k1_gej *)&stack0xfffffffffffffd08,x,
                     (secp256k1_ecmult_multi_callback *)0x0,(void *)0x0,0);
  if (iVar1 == 0) {
    psStack_bd0 = (secp256k1_strauss_point_state *)0x16977d;
    test_ecmult_accumulate_cold_8();
LAB_0016977d:
    psStack_bd0 = (secp256k1_strauss_point_state *)0x169782;
    test_ecmult_accumulate_cold_7();
LAB_00169782:
    psStack_bd0 = (secp256k1_strauss_point_state *)0x169787;
    test_ecmult_accumulate_cold_6();
LAB_00169787:
    psStack_bd0 = (secp256k1_strauss_point_state *)0x16978c;
    test_ecmult_accumulate_cold_5();
LAB_0016978c:
    psStack_bd0 = (secp256k1_strauss_point_state *)0x169791;
    test_ecmult_accumulate_cold_4();
LAB_00169791:
    psStack_bd0 = (secp256k1_strauss_point_state *)0x169796;
    test_ecmult_accumulate_cold_3();
LAB_00169796:
    psStack_bd0 = (secp256k1_strauss_point_state *)0x16979b;
    test_ecmult_accumulate_cold_2();
  }
  else {
    error_callback = &CTX->error_callback;
    ng = &secp256k1_scalar_zero;
    cb = test_ecmult_accumulate_cb;
    psStack_bd0 = (secp256k1_strauss_point_state *)0x1695d9;
    scratch_00 = (secp256k1_strauss_point_state *)scratch;
    elem = (secp256k1_strauss_point_state *)error_callback;
    cbdata = x;
    iVar1 = secp256k1_ecmult_multi_var
                      (error_callback,scratch,local_948,&secp256k1_scalar_zero,
                       test_ecmult_accumulate_cb,x,1);
    if (iVar1 == 0) goto LAB_0016977d;
    psStack_bd0 = (secp256k1_strauss_point_state *)0x1695f8;
    secp256k1_ecmult_const(&local_b48,&secp256k1_ge_const_g,x);
    x = (secp256k1_scalar *)local_ba0;
    psStack_bd0 = (secp256k1_strauss_point_state *)0x16960d;
    secp256k1_ge_set_gej_var((secp256k1_ge *)x,&local_9c8);
    r_01 = &local_808;
    psStack_bd0 = (secp256k1_strauss_point_state *)0x169625;
    secp256k1_gej_neg((secp256k1_gej *)r_01,&local_a48);
    ng = (secp256k1_scalar *)0x0;
    psStack_bd0 = (secp256k1_strauss_point_state *)0x169635;
    scratch_00 = r_01;
    elem = r_01;
    secp256k1_gej_add_ge_var
              ((secp256k1_gej *)r_01,(secp256k1_gej *)r_01,(secp256k1_ge *)x,(secp256k1_fe *)0x0);
    if (local_808.wnaf_na_1[0x1e] == 0) goto LAB_00169782;
    x = (secp256k1_scalar *)&local_808;
    psStack_bd0 = (secp256k1_strauss_point_state *)0x169658;
    secp256k1_gej_neg((secp256k1_gej *)x,&local_ac8);
    ng = (secp256k1_scalar *)0x0;
    psStack_bd0 = (secp256k1_strauss_point_state *)0x16966a;
    scratch_00 = (secp256k1_strauss_point_state *)x;
    elem = (secp256k1_strauss_point_state *)x;
    secp256k1_gej_add_ge_var
              ((secp256k1_gej *)x,(secp256k1_gej *)x,(secp256k1_ge *)local_ba0,(secp256k1_fe *)0x0);
    if (local_808.wnaf_na_1[0x1e] == 0) goto LAB_00169787;
    x = (secp256k1_scalar *)&local_808;
    psStack_bd0 = (secp256k1_strauss_point_state *)0x16968d;
    secp256k1_gej_neg((secp256k1_gej *)x,(secp256k1_gej *)&stack0xfffffffffffffd08);
    ng = (secp256k1_scalar *)0x0;
    psStack_bd0 = (secp256k1_strauss_point_state *)0x16969f;
    scratch_00 = (secp256k1_strauss_point_state *)x;
    elem = (secp256k1_strauss_point_state *)x;
    secp256k1_gej_add_ge_var
              ((secp256k1_gej *)x,(secp256k1_gej *)x,(secp256k1_ge *)local_ba0,(secp256k1_fe *)0x0);
    if (local_808.wnaf_na_1[0x1e] == 0) goto LAB_0016978c;
    x = (secp256k1_scalar *)&local_808;
    psStack_bd0 = (secp256k1_strauss_point_state *)0x1696c2;
    secp256k1_gej_neg((secp256k1_gej *)x,local_948);
    ng = (secp256k1_scalar *)0x0;
    psStack_bd0 = (secp256k1_strauss_point_state *)0x1696d4;
    scratch_00 = (secp256k1_strauss_point_state *)x;
    elem = (secp256k1_strauss_point_state *)x;
    secp256k1_gej_add_ge_var
              ((secp256k1_gej *)x,(secp256k1_gej *)x,(secp256k1_ge *)local_ba0,(secp256k1_fe *)0x0);
    if (local_808.wnaf_na_1[0x1e] == 0) goto LAB_00169791;
    x = (secp256k1_scalar *)&local_808;
    psStack_bd0 = (secp256k1_strauss_point_state *)0x1696f7;
    secp256k1_gej_neg((secp256k1_gej *)x,&local_b48);
    ng = (secp256k1_scalar *)0x0;
    psStack_bd0 = (secp256k1_strauss_point_state *)0x169709;
    scratch_00 = (secp256k1_strauss_point_state *)x;
    elem = (secp256k1_strauss_point_state *)x;
    secp256k1_gej_add_ge_var
              ((secp256k1_gej *)x,(secp256k1_gej *)x,(secp256k1_ge *)local_ba0,(secp256k1_fe *)0x0);
    if (local_808.wnaf_na_1[0x1e] == 0) goto LAB_00169796;
    if (local_ba0._80_4_ != 0) {
      local_808.wnaf_na_1[0]._0_1_ = 0;
      sVar5 = 1;
LAB_0016975c:
      psStack_bd0 = (secp256k1_strauss_point_state *)0x169766;
      secp256k1_sha256_write(acc,(uchar *)&local_808,sVar5);
      return;
    }
    elem = (secp256k1_strauss_point_state *)local_ba0;
    scratch_00 = &local_808;
    x = (secp256k1_scalar *)local_ba8;
    ng = (secp256k1_scalar *)0x0;
    psStack_bd0 = (secp256k1_strauss_point_state *)0x169749;
    secp256k1_eckey_pubkey_serialize((secp256k1_ge *)elem,(uchar *)scratch_00,(size_t *)x,0);
    if (local_ba8 == (undefined1  [8])0x41) {
      sVar5 = 0x41;
      goto LAB_0016975c;
    }
  }
  psStack_bd0 = (secp256k1_strauss_point_state *)secp256k1_ecmult_multi_var;
  test_ecmult_accumulate_cold_1();
  r_00->infinity = 1;
  (r_00->x).n[0] = 0;
  (r_00->x).n[1] = 0;
  (r_00->x).n[2] = 0;
  (r_00->x).n[3] = 0;
  (r_00->x).n[4] = 0;
  (r_00->y).n[0] = 0;
  (r_00->y).n[1] = 0;
  (r_00->y).n[2] = 0;
  (r_00->y).n[3] = 0;
  (r_00->y).n[4] = 0;
  (r_00->z).n[0] = 0;
  (r_00->z).n[1] = 0;
  (r_00->z).n[2] = 0;
  (r_00->z).n[3] = 0;
  (r_00->z).n[4] = 0;
  if (ng != (secp256k1_scalar *)0x0 || sStack_bc0 != 0) {
    psStack_bf8 = scratch;
    psStack_bf0 = error_callback;
    psStack_be8 = &local_3f8;
    psStack_be0 = (secp256k1_strauss_point_state *)x;
    psStack_bd8 = r_01;
    psStack_bd0 = &local_808;
    if (sStack_bc0 == 0) {
      sStack_1428.aux = asStack_1410;
      sStack_1428.pre_a = asStack_ec0;
      sStack_1428.ps = &sStack_12d0;
      secp256k1_ecmult_strauss_wnaf(&sStack_1428,r_00,1,r_00,&secp256k1_scalar_zero,ng);
    }
    else {
      if ((scratch_00 == (secp256k1_strauss_point_state *)0x0) ||
         (sVar5 = secp256k1_pippenger_max_points
                            ((secp256k1_callback *)elem,(secp256k1_scratch *)scratch_00), sVar5 == 0
         )) {
LAB_001699f5:
        secp256k1_ecmult_multi_simple_var(r_00,ng,cb,cbdata,sStack_bc0);
        return;
      }
      uVar2 = 5000000;
      if (sVar5 < 5000000) {
        uVar2 = sVar5;
      }
      uVar8 = sStack_bc0 - 1;
      uStack_1430 = uVar8 / uVar2 + 1;
      uVar2 = uVar8 / uStack_1430;
      if (uVar2 < 0x57) {
        lVar7 = 0;
        do {
          if (*(char *)((long)((secp256k1_fe *)scratch_00->wnaf_na_1)->n + lVar7) !=
              "scratch"[lVar7]) {
            (*(code *)((secp256k1_fe *)elem->wnaf_na_1)->n[0])
                      ("invalid scratch space",((secp256k1_fe *)elem->wnaf_na_1)->n[1]);
            goto LAB_001699f5;
          }
          lVar7 = lVar7 + 1;
        } while (lVar7 != 8);
        uVar6 = ((secp256k1_fe *)scratch_00->wnaf_na_1)->n[3] -
                ((secp256k1_fe *)scratch_00->wnaf_na_1)->n[2];
        uVar2 = 0;
        if (0x4a < uVar6) {
          uVar2 = uVar6 - 0x4b;
        }
        if (uVar2 < 0x8b0) goto LAB_001699f5;
        uVar2 = uVar2 / 0x8b0;
        if (4999999 < uVar2) {
          uVar2 = 5000000;
        }
        uStack_1430 = uVar8 / uVar2 + 1;
        uVar2 = uVar8 / uStack_1430;
        pcVar3 = secp256k1_ecmult_strauss_batch;
      }
      else {
        pcVar3 = secp256k1_ecmult_pippenger_batch;
      }
      uVar2 = uVar2 + 1;
      lVar7 = 0;
      uVar8 = 0;
      do {
        uVar6 = uVar2;
        if (sStack_bc0 < uVar2) {
          uVar6 = sStack_bc0;
        }
        psVar4 = (secp256k1_scalar *)0x0;
        if (uVar8 == 0) {
          psVar4 = ng;
        }
        iVar1 = (*pcVar3)(elem,scratch_00,&sStack_12d0,psVar4,cb,cbdata,uVar6,lVar7);
        if (iVar1 == 0) {
          return;
        }
        secp256k1_gej_add_var(r_00,r_00,(secp256k1_gej *)&sStack_12d0,(secp256k1_fe *)0x0);
        sStack_bc0 = sStack_bc0 - uVar6;
        uVar8 = uVar8 + 1;
        lVar7 = lVar7 + uVar2;
      } while (uStack_1430 != uVar8);
    }
  }
  return;
}

Assistant:

static void test_ecmult_accumulate(secp256k1_sha256* acc, const secp256k1_scalar* x, secp256k1_scratch* scratch) {
    /* Compute x*G in 6 different ways, serialize it uncompressed, and feed it into acc. */
    secp256k1_gej rj1, rj2, rj3, rj4, rj5, rj6, gj, infj;
    secp256k1_ge r;
    unsigned char bytes[65];
    size_t size = 65;
    secp256k1_gej_set_ge(&gj, &secp256k1_ge_const_g);
    secp256k1_gej_set_infinity(&infj);
    secp256k1_ecmult_gen(&CTX->ecmult_gen_ctx, &rj1, x);
    secp256k1_ecmult(&rj2, &gj, x, &secp256k1_scalar_zero);
    secp256k1_ecmult(&rj3, &infj, &secp256k1_scalar_zero, x);
    CHECK(secp256k1_ecmult_multi_var(&CTX->error_callback, scratch, &rj4, x, NULL, NULL, 0));
    CHECK(secp256k1_ecmult_multi_var(&CTX->error_callback, scratch, &rj5, &secp256k1_scalar_zero, test_ecmult_accumulate_cb, (void*)x, 1));
    secp256k1_ecmult_const(&rj6, &secp256k1_ge_const_g, x);
    secp256k1_ge_set_gej_var(&r, &rj1);
    CHECK(secp256k1_gej_eq_ge_var(&rj2, &r));
    CHECK(secp256k1_gej_eq_ge_var(&rj3, &r));
    CHECK(secp256k1_gej_eq_ge_var(&rj4, &r));
    CHECK(secp256k1_gej_eq_ge_var(&rj5, &r));
    CHECK(secp256k1_gej_eq_ge_var(&rj6, &r));
    if (secp256k1_ge_is_infinity(&r)) {
        /* Store infinity as 0x00 */
        const unsigned char zerobyte[1] = {0};
        secp256k1_sha256_write(acc, zerobyte, 1);
    } else {
        /* Store other points using their uncompressed serialization. */
        secp256k1_eckey_pubkey_serialize(&r, bytes, &size, 0);
        CHECK(size == 65);
        secp256k1_sha256_write(acc, bytes, size);
    }
}